

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

void __thiscall
LNodeIEStmt::LNodeIEStmt
          (LNodeIEStmt *this,shared_ptr<LNode> *condition,shared_ptr<LNode> *then_branch,
          shared_ptr<LNode> *else_branch)

{
  shared_ptr<LNode> *else_branch_local;
  shared_ptr<LNode> *then_branch_local;
  shared_ptr<LNode> *condition_local;
  LNodeIEStmt *this_local;
  
  std::shared_ptr<LNode>::shared_ptr(&this->condition);
  std::shared_ptr<LNode>::shared_ptr(&this->then_branch);
  std::shared_ptr<LNode>::shared_ptr(&this->else_branch);
  std::shared_ptr<LNode>::operator=(&this->condition,condition);
  std::shared_ptr<LNode>::operator=(&this->then_branch,then_branch);
  std::shared_ptr<LNode>::operator=(&this->else_branch,else_branch);
  return;
}

Assistant:

LNodeIEStmt(std::shared_ptr<LNode> condition,
                std::shared_ptr<LNode> then_branch, std::shared_ptr<LNode> else_branch) {
        this->condition = std::move(condition);
        this->then_branch = std::move(then_branch);
        this->else_branch = std::move(else_branch);
    }